

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_0::PartialOccluderCullCase::logDescription
          (PartialOccluderCullCase *this)

{
  ostringstream *poVar1;
  TestLog *this_00;
  size_t in_RCX;
  void *__buf;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [384];
  
  this_00 = ((this->super_RelativeChangeCase).super_BaseCase.super_TestCase.super_TestNode.m_testCtx
            )->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"Description",&local_1d9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"Test description",&local_1da);
  tcu::LogSection::LogSection((LogSection *)local_198,&local_1b8,&local_1d8);
  tcu::LogSection::write((LogSection *)local_198,(int)this_00,__buf,in_RCX);
  tcu::LogSection::~LogSection((LogSection *)local_198);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Testing effects of partial occluder on rendering time");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Geometry consists of two quads. The first (occluding) quad covers ");
  std::ostream::operator<<(poVar1,this->m_coverage * 100.0);
  std::operator<<((ostream *)poVar1,
                  "% of the screen, while the second (partially occluded, fullscreen) contains significant fragment shader work"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Workload indicates the number of iterations of dummy work done in the occluded quad\'s fragment shader"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "The ratio of rendering times of this scene with/without depth testing are compared"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Successfull early Z-testing should result in render time increasing proportionally with unoccluded area"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::TestLog::endSection(this_00);
  return;
}

Assistant:

virtual void		logDescription				(void)
	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Section("Description", "Test description");
		log << TestLog::Message << "Testing effects of partial occluder on rendering time" << TestLog::EndMessage;
		log << TestLog::Message << "Geometry consists of two quads. The first (occluding) quad covers " << m_coverage*100.0f
			<< "% of the screen, while the second (partially occluded, fullscreen) contains significant fragment shader work" << TestLog::EndMessage;
		log << TestLog::Message << "Workload indicates the number of iterations of dummy work done in the occluded quad's fragment shader"  << TestLog::EndMessage;
		log << TestLog::Message << "The ratio of rendering times of this scene with/without depth testing are compared"  << TestLog::EndMessage;
		log << TestLog::Message << "Successfull early Z-testing should result in render time increasing proportionally with unoccluded area"  << TestLog::EndMessage;
		log << TestLog::EndSection;
	}